

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin.c
# Opt level: O0

int coda_bin_reopen_with_definition(coda_product **product,coda_product_definition *definition)

{
  coda_product *pcVar1;
  coda_bin_product *product_file;
  coda_product_definition *definition_local;
  coda_product **product_local;
  
  pcVar1 = *product;
  if (definition == (coda_product_definition *)0x0) {
    __assert_fail("definition != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin.c"
                  ,0x120,
                  "int coda_bin_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  if (pcVar1->format == coda_format_binary) {
    if (definition->format == coda_format_binary) {
      pcVar1->root_type = (coda_dynamic_type *)definition->root_type;
      pcVar1->product_definition = definition;
      return 0;
    }
    __assert_fail("definition->format == coda_format_binary",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin.c"
                  ,0x122,
                  "int coda_bin_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  __assert_fail("product_file->format == coda_format_binary",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin.c"
                ,0x121,
                "int coda_bin_reopen_with_definition(coda_product **, const coda_product_definition *)"
               );
}

Assistant:

int coda_bin_reopen_with_definition(coda_product **product, const coda_product_definition *definition)
{
    coda_bin_product *product_file = *(coda_bin_product **)product;

    assert(definition != NULL);
    assert(product_file->format == coda_format_binary);
    assert(definition->format == coda_format_binary);

    product_file->root_type = (coda_dynamic_type *)definition->root_type;
    product_file->product_definition = definition;

    return 0;
}